

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_string.cpp
# Opt level: O0

void __thiscall string::unicode_too_big::test_method(unicode_too_big *this)

{
  undefined8 uVar1;
  bool bVar2;
  lazy_ostream *plVar3;
  logic_error *ex;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[51],_const_char_(&)[51]> local_168;
  assertion_result local_148;
  basic_cstring<const_char> local_130;
  basic_cstring<const_char> local_120;
  JSONParser local_110;
  basic_cstring<const_char> local_f0;
  basic_cstring<const_char> local_e0;
  undefined4 local_d0;
  JSONType local_cc;
  basic_cstring<const_char> local_c8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_b8;
  basic_cstring<const_char> local_90;
  basic_cstring<const_char> local_80;
  undefined1 local_70 [8];
  JSONParser parser;
  allocator local_39;
  string local_38 [8];
  string json;
  unicode_too_big *this_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"\"This is \\u12345 unicode\"",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  yajp::JSONParser::JSONParser((JSONParser *)local_70,(string *)local_38,false);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_80,
               "/workspace/llm4binary/github/license_all_cmakelists_25/matiu2[P]yajp/tests/parser/test_string.cpp"
               ,0x61);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_90);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_80,0x83,&local_90);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_b8,plVar3,(char (*) [1])0x12473b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/matiu2[P]yajp/tests/parser/test_string.cpp"
               ,0x61);
    local_cc = yajp::JSONParser::getNextType((JSONParser *)local_70,false);
    local_d0 = 0x22;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,yajp::JSONParser::JSONType,yajp::JSONParser::JSONType>
              (&local_b8,&local_c8,0x83,1,2,&local_cc,"parser.getNextType()",&local_d0,
               "yajp::JSONParser::string");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_b8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/matiu2[P]yajp/tests/parser/test_string.cpp"
               ,0x61);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_f0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_e0,0x84,&local_f0);
    yajp::JSONParser::readString_abi_cxx11_(&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    do {
      uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_120,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/matiu2[P]yajp/tests/parser/test_string.cpp"
                 ,0x61);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_130);
      boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_120,0x84,&local_130);
      boost::test_tools::assertion_result::assertion_result(&local_148,false);
      plVar3 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (&local_168,plVar3,
                 (char (*) [51])"exception std::logic_error expected but not raised");
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)&ex,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/matiu2[P]yajp/tests/parser/test_string.cpp"
                 ,0x61);
      boost::test_tools::tt_detail::report_assertion(&local_148,&local_168,&ex,0x84,2,1,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[51],_const_char_(&)[51]>::
      ~lazy_ostream_impl(&local_168);
      boost::test_tools::assertion_result::~assertion_result(&local_148);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE( unicode_too_big ) {
    std::string json("\"This is \\u12345 unicode\"");

    yajp::JSONParser parser(json);
    BOOST_CHECK_EQUAL(parser.getNextType(), yajp::JSONParser::string);
    BOOST_REQUIRE_THROW(parser.readString(), std::logic_error);
}